

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

void __thiscall Analyzer::checkUnutilizedResult(Analyzer *this,Node *node)

{
  int iVar1;
  bool bVar2;
  reference ppNVar3;
  long in_RSI;
  char *unaff_retaddr;
  Analyzer *in_stack_00000008;
  TokenType t;
  char *functionName_1;
  char *functionName;
  char *in_stack_000006c8;
  char *in_stack_000006d0;
  char *in_stack_000006d8;
  Token *in_stack_000006e0;
  char *in_stack_000006e8;
  CompilationContext *in_stack_000006f0;
  char *in_stack_00000700;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Analyzer *in_stack_ffffffffffffffe0;
  
  if (in_RSI != 0) {
    if ((((*(int *)(in_RSI + 0x10) == 4) || (*(int *)(in_RSI + 0x10) == 2)) ||
        (*(int *)(in_RSI + 0x10) == 3)) || (*(int *)(in_RSI + 0x10) == 5)) {
      CompilationContext::warning
                (in_stack_000006f0,in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,
                 in_stack_000006d0,in_stack_000006c8,in_stack_00000700);
    }
    else {
      if ((*(int *)(in_RSI + 0x10) == 0x17) &&
         (ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0),
         (*ppNVar3)->nodeType == PNT_IDENTIFIER)) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0);
        bVar2 = nameLooksLikeResultMustBeUtilised
                          (in_stack_ffffffffffffffe0,
                           (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        if ((bVar2) && (bVar2 = isWatchedVariable(in_stack_00000008,unaff_retaddr), !bVar2)) {
          CompilationContext::warning
                    (in_stack_000006f0,in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,
                     in_stack_000006d0,in_stack_000006c8,in_stack_00000700);
          return;
        }
      }
      if ((*(int *)(in_RSI + 0x10) == 0x17) &&
         ((ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                               ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0),
          (*ppNVar3)->nodeType == PNT_ACCESS_MEMBER ||
          (ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                               ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0),
          (*ppNVar3)->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)))) {
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0);
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&(*ppNVar3)->children,1);
        if ((*ppNVar3)->nodeType == PNT_IDENTIFIER) {
          ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RSI + 0x18),0);
          ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              (&(*ppNVar3)->children,1);
          bVar2 = nameLooksLikeResultMustBeUtilised
                            ((Analyzer *)((*ppNVar3)->tok->u).s,
                             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          if ((bVar2) && (bVar2 = isWatchedVariable(in_stack_00000008,unaff_retaddr), !bVar2)) {
            CompilationContext::warning
                      (in_stack_000006f0,in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,
                       in_stack_000006d0,in_stack_000006c8,in_stack_00000700);
            return;
          }
        }
      }
      if (((((*(int *)(in_RSI + 0x10) == 0xf) || (*(int *)(in_RSI + 0x10) == 0x10)) ||
           (*(int *)(in_RSI + 0x10) == 0xd)) ||
          (((*(int *)(in_RSI + 0x10) == 6 || (*(int *)(in_RSI + 0x10) == 0x15)) ||
           (*(int *)(in_RSI + 0x10) == 0x16)))) &&
         ((((iVar1 = **(int **)(in_RSI + 8), iVar1 == 0x2f || (iVar1 == 0x23)) ||
           (((iVar1 == 0x24 || (((iVar1 == 0x45 || (iVar1 == 0x62)) || (iVar1 == 0x1f)))) ||
            ((iVar1 == 0x20 || (iVar1 == 0x21)))))) ||
          (((iVar1 == 0x1d ||
            (((iVar1 == 0x1e || (iVar1 == 0x22)) ||
             ((iVar1 == 0xe ||
              (((((iVar1 == 0xf || (iVar1 == 0x12)) || (iVar1 == 0x11)) ||
                ((iVar1 == 0x10 || (iVar1 == 0xd)))) || (iVar1 == 0x26)))))))) ||
           (((iVar1 == 0x57 || (iVar1 == 0x31)) ||
            ((iVar1 == 0xb ||
             ((((((iVar1 == 10 || (iVar1 == 0xc)) || (iVar1 == 0x2c)) ||
                (((iVar1 == 0x2d || (iVar1 == 0x2e)) ||
                 ((iVar1 == 0x4a || ((iVar1 == 0x47 || (*(int *)(in_RSI + 0x10) == 6)))))))) ||
               (*(int *)(in_RSI + 0x10) == 0x15)) || (*(int *)(in_RSI + 0x10) == 0x16)))))))))))) {
        CompilationContext::warning
                  (in_stack_000006f0,in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,
                   in_stack_000006d0,in_stack_000006c8,in_stack_00000700);
      }
    }
  }
  return;
}

Assistant:

void checkUnutilizedResult(Node * node)
  {
    if (!node)
      return;

    if (node->nodeType == PNT_FLOAT || node->nodeType == PNT_INTEGER || node->nodeType == PNT_BOOL ||
      node->nodeType == PNT_STRING)
    {
      ctx.warning("result-not-utilized", node->tok);
      return;
    }

    if (node->nodeType == PNT_FUNCTION_CALL && node->children[0]->nodeType == PNT_IDENTIFIER)
    {
      const char * functionName = node->children[0]->tok.u.s;
      if (nameLooksLikeResultMustBeUtilised(functionName))
      {
        if (!isWatchedVariable(functionName))
        {
          ctx.warning("named-like-should-return", node->tok, functionName);
          return;
        }
      }
    }

    if (node->nodeType == PNT_FUNCTION_CALL &&
      (node->children[0]->nodeType == PNT_ACCESS_MEMBER || node->children[0]->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL) &&
      node->children[0]->children[1]->nodeType == PNT_IDENTIFIER)
    {
      const char * functionName = node->children[0]->children[1]->tok.u.s;
      if (nameLooksLikeResultMustBeUtilised(functionName))
      {
        if (!isWatchedVariable(functionName))
        {
          ctx.warning("named-like-should-return", node->tok, functionName);
          return;
        }
      }
    }

    if (node->nodeType == PNT_BINARY_OP || node->nodeType == PNT_TERNARY_OP ||
      node->nodeType == PNT_UNARY_PRE_OP || node->nodeType == PNT_IDENTIFIER ||
      node->nodeType == PNT_ACCESS_MEMBER || node->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
    {
      TokenType t = node->tok.type;
      if (t == TK_3WAYSCMP || t == TK_AND || t == TK_OR || t == TK_IN || t == TK_NOTIN || t == TK_EQ || t == TK_NE || t == TK_LE ||
        t == TK_LS || t == TK_GT || t == TK_GE || t == TK_NOT || t == TK_INV || t == TK_BITAND || t == TK_BITOR ||
        t == TK_BITXOR || t == TK_DIV || t == TK_MODULO || t == TK_INSTANCEOF || t == TK_QMARK || t == TK_MINUS ||
        t == TK_PLUS || t == TK_MUL || t == TK_SHIFTL || t == TK_SHIFTR || t == TK_USHIFTR || t == TK_TYPEOF ||
        t == TK_CLONE ||
        node->nodeType == PNT_IDENTIFIER || node->nodeType == PNT_ACCESS_MEMBER ||
        node->nodeType == PNT_ACCESS_MEMBER_IF_NOT_NULL)
      {
        ctx.warning("result-not-utilized", node->tok);
      }
    }
  }